

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int rsa2_pubkey_bits(ssh_keyalg *self,ptrlen pub)

{
  int iVar1;
  ssh_key *key;
  size_t sVar2;
  
  key = rsa2_new_pub(self,pub);
  if (key == (ssh_key *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar2 = mp_get_nbits((mp_int *)key[-7].vt);
    iVar1 = (int)sVar2;
    rsa2_freekey(key);
  }
  return iVar1;
}

Assistant:

static int rsa2_pubkey_bits(const ssh_keyalg *self, ptrlen pub)
{
    ssh_key *sshk;
    RSAKey *rsa;
    int ret;

    sshk = rsa2_new_pub(self, pub);
    if (!sshk)
        return -1;

    rsa = container_of(sshk, RSAKey, sshk);
    ret = mp_get_nbits(rsa->modulus);
    rsa2_freekey(&rsa->sshk);

    return ret;
}